

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,2,1,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  pair<unsigned_long,_unsigned_long> *ppVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  comm *comm_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  long *plVar7;
  _Elt_pointer ppVar8;
  _Map_pointer pppVar9;
  _Map_pointer pppVar10;
  _Map_pointer pppVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  _Elt_pointer ppVar15;
  ulong uVar16;
  _Elt_pointer ppVar17;
  _Elt_pointer ppVar18;
  long lVar19;
  _Elt_pointer ppVar20;
  _Elt_pointer ppVar21;
  _Elt_pointer ppVar22;
  unsigned_long uVar23;
  unsigned_long uVar24;
  _Elt_pointer ppVar25;
  _Elt_pointer ppVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  _Map_pointer pppVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  unsigned_long uVar34;
  comm *pcVar35;
  long lVar36;
  pair<unsigned_long,_unsigned_long> *ppVar37;
  _Elt_pointer ppVar38;
  pointer puVar39;
  bool bVar40;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1d8;
  _Elt_pointer local_188;
  _Elt_pointer local_180;
  comm *local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_170;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_168;
  _Elt_pointer local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_158;
  size_type local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  _Map_pointer local_130;
  pair<unsigned_long,_unsigned_long> local_128;
  unsigned_long local_118;
  unsigned_long local_110;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Map_pointer local_90;
  _Elt_pointer local_88;
  _Elt_pointer local_80;
  long local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_168 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_118 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1d8,0);
  local_150 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_178 = comm;
  local_180 = (_Elt_pointer)mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_150,comm);
  lVar36 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_170 = in;
  if (lVar36 != 0) {
    lVar36 = lVar36 >> 3;
    lVar31 = (long)local_180 - 1;
LAB_0013f09b:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar36 + -1] < ppVar38[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013f09b;
        }
      }
      while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar36 + -1] != ppVar38[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar36 + lVar31);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar36 + -1];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar36 = lVar36 + -1;
    } while (lVar36 != 0);
  }
  local_50.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_148,&local_50,&local_70,(allocator_type *)&local_a8);
  pvVar2 = *(void **)local_168;
  *(pointer *)local_168 =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_168 + 8) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_168 + 0x10) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  local_158 = right_nsv;
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar11 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar22 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = (_Elt_pointer)
              (((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20);
  local_160 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar38 = local_180;
  pvVar5 = local_170;
  if (local_188 == (_Elt_pointer)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 1]"
                 );
  }
  for (; local_180 = ppVar38, local_170 = pvVar5, pppVar9 < pppVar11; pppVar9 = pppVar9 + 1) {
    operator_delete(pppVar9[1]);
    ppVar38 = local_180;
    pvVar5 = local_170;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar8;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar22;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar10;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_160;
  if ((pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar33 = 0;
LAB_0013f34d:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar33] < ppVar8[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013f34d;
        }
      }
      while (lVar36 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar36 +
                ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x20) {
        ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar34 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar33];
        if (uVar34 != ppVar8[-1].first) break;
        uVar12 = lVar36 - 1;
        if (uVar12 < 0x20) {
          ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar22 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar16 = uVar12 >> 5 | 0xf800000000000000;
          if (1 < lVar36) {
            uVar16 = uVar12 >> 5;
          }
          pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + uVar16;
          ppVar22 = *pppVar9;
          ppVar8 = ppVar22 + uVar12 + uVar16 * -0x20;
        }
        if (ppVar8 == ppVar22) {
          ppVar8 = pppVar9[-1] + 0x20;
        }
        if (uVar34 != ppVar8[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar33 + (long)ppVar38);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar33];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < (ulong)((long)(pvVar5->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar5->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar25 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar20 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar22 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar33 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar40 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_130 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_90 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_168,*(undefined8 *)(local_168 + 8));
  pppVar11 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_110 = (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar36 = ((long)ppVar22 - (long)ppVar38 >> 4) + ((long)ppVar20 - (long)ppVar25 >> 4) +
           (((uVar33 >> 3) - 1) + (ulong)bVar40) * 0x20;
  ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar22 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar35 = local_178;
  if (lVar36 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 1]"
                 );
  }
  for (; local_160 = ppVar22, local_180 = ppVar38, local_178 = pcVar35, pppVar9 < pppVar11;
      pppVar9 = pppVar9 + 1) {
    operator_delete(pppVar9[1]);
    ppVar38 = local_180;
    ppVar22 = local_160;
    pcVar35 = local_178;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar8;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar10;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_180;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_160;
  if (lVar36 + (long)local_188 != *(long *)(local_168 + 8) - *(long *)local_168 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_148,&local_110,1,pcVar35);
  local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,(long)pcVar35->m_size,(value_type_conflict *)&local_c0,
             (allocator_type *)&local_f0);
  local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,(long)pcVar35->m_size,(value_type_conflict *)&local_f0,
             (allocator_type *)&local_d8);
  comm_00 = local_178;
  iVar1 = pcVar35->m_rank;
  lVar36 = (long)iVar1;
  if (0 < lVar36) {
    uVar33 = *(ulong *)((long)local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar36 * 8 + -8);
    lVar31 = lVar36;
    uVar34 = 0;
    do {
      lVar19 = lVar31 + -1;
      ppVar38 = (_Elt_pointer)(uVar34 + 1);
      if (uVar34 + 1 < local_188) {
        ppVar38 = local_188;
      }
      puVar27 = (ulong *)(uVar34 * 0x10 + *(long *)local_168);
      uVar23 = uVar34 - 1;
      do {
        uVar24 = (long)ppVar38 - 1;
        if ((1 - (long)ppVar38) + uVar23 == -1) break;
        uVar12 = *puVar27;
        uVar24 = uVar23 + 1;
        puVar27 = puVar27 + 2;
        uVar23 = uVar24;
      } while (*(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar19 * 8) <= uVar12);
      uVar12 = *(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar19 * 8);
      iVar13 = 0x12;
      if (uVar12 <= uVar33) {
        *(unsigned_long *)
         ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar19 * 8) = (uVar24 - uVar34) + 1;
        local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = uVar34;
        iVar13 = (uint)(*(ulong *)((long)local_148.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar19 * 8) <
                       local_110) << 4;
        uVar33 = uVar12;
      }
    } while (((iVar13 == 0x12) || (iVar13 == 0)) &&
            (bVar40 = 1 < lVar31, lVar31 = lVar19, uVar34 = uVar24, bVar40));
  }
  iVar13 = local_178->m_size;
  if ((iVar1 < iVar13 + -1) && (iVar1 + 1 < iVar13)) {
    lVar31 = *(long *)local_168;
    uVar16 = *(long *)(local_168 + 8) - lVar31 >> 4;
    uVar33 = ((unsigned_long *)
             ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar36];
    local_180 = (_Elt_pointer)
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar36 = lVar36 + 1;
    uVar12 = uVar16 - 1;
    iVar32 = iVar1;
    do {
      uVar29 = uVar12;
      if (iVar1 < iVar32) {
        uVar14 = uVar12 + 1;
        if (uVar12 + 1 < uVar16) {
          uVar14 = uVar16;
        }
        puVar27 = (ulong *)(uVar12 * 0x10 + lVar31 + 0x10);
        uVar28 = uVar12 - 1;
        do {
          uVar29 = uVar14 - 1;
          if (uVar16 <= uVar28 + 2) break;
          uVar29 = uVar28 + 1;
          uVar3 = *puVar27;
          puVar27 = puVar27 + 2;
          uVar28 = uVar29;
        } while (uVar3 <= uVar33);
      }
      ppVar38 = (_Elt_pointer)uVar12;
      if (local_188 < uVar12) {
        puVar27 = (ulong *)(uVar12 * 0x10 + lVar31);
        do {
          ppVar38 = (_Elt_pointer)uVar12;
          if (*puVar27 <
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar36]) break;
          uVar12 = uVar12 - 1;
          puVar27 = puVar27 + -2;
          ppVar38 = local_188;
        } while (local_188 < uVar12);
      }
      uVar12 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar36];
      iVar32 = 0x17;
      if (uVar12 <= uVar33) {
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar36] = (uVar29 - (long)ppVar38) + 1;
        local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar36] = (unsigned_long)ppVar38;
        iVar32 = 0;
        uVar33 = uVar12;
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar36] < local_110) {
          iVar32 = 0x15;
        }
      }
      if ((iVar32 != 0x17) && (iVar32 != 0)) break;
      iVar32 = (int)lVar36;
      lVar36 = lVar36 + 1;
      uVar12 = (ulong)ppVar38;
    } while (iVar13 != (int)lVar36);
  }
  mxx::all2all<unsigned_long>(&local_f0,&local_a8,local_178);
  mxx::impl::get_displacements<unsigned_long>(&local_d8,&local_f0);
  pvVar5 = local_158;
  uVar34 = local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar23 = local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_108,(size_type)(uVar34 + uVar23),(allocator_type *)&local_128);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_168,&local_a8,&local_c0,
             local_108.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f0,&local_d8,comm_00);
  local_188 = (_Elt_pointer)
              local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  local_80 = (_Elt_pointer)(uVar34 + uVar23);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_150);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar5,local_150);
  pppVar11 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_178 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  for (pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node; pppVar9 < pppVar11;
      pppVar9 = pppVar9 + 1) {
    operator_delete(pppVar9[1]);
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar38;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar8;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar10;
  lVar36 = (long)(local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_178;
  if (lVar36 != 0) {
    uVar34 = lVar36 >> 3;
    do {
      uVar34 = uVar34 - 1;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar39 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar38[-1].first <= puVar39[uVar34]) break;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar37 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar37[0x1f].second] = uVar34;
            ppVar38 = ppVar37 + 0x20;
          }
          else {
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar34;
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar23 = ppVar38[-1].first;
          uVar24 = ppVar38[-1].second;
          while( true ) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (uVar23 != ppVar38[-1].first) break;
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar24;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_128.first =
           (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar34];
      local_128.second = uVar34;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_128);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_128.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar34;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (uVar34 != 0);
  }
  if (local_188 != (_Elt_pointer)0x0) {
    local_88 = (_Elt_pointer)((long)&local_188[-1].second + 7);
    local_78 = (long)local_188 * 0x10 + -0x10;
    ppVar38 = (_Elt_pointer)0x0;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_180 = (_Elt_pointer)((long)&local_188->first + ~(ulong)ppVar38);
      local_160 = (_Elt_pointer)((long)local_180 * 0x10);
      ppVar37 = local_108.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_180;
      uVar34 = local_150 + (long)local_180;
      local_178 = (comm *)ppVar38;
      do {
        ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar38[-1].first <= ppVar37->first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar4[0x1f].second] = uVar34;
          ppVar38 = ppVar4 + 0x20;
        }
        else {
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar34;
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        uVar23 = ppVar38[-1].first;
        uVar24 = ppVar38[-1].second;
        while( true ) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (uVar23 != ppVar38[-1].first) break;
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar24;
        }
      } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      pcVar35 = local_178;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (*(unsigned_long *)
             ((long)&local_160->first +
             (long)&(local_108.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar38[-1].first) {
          ppVar38 = local_180;
          if (local_180 != (_Elt_pointer)0x0) {
            plVar7 = (long *)((long)&local_108.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-(long)local_178].
                                     first + local_78);
            do {
              if (*plVar7 != plVar7[-2]) goto LAB_0013fd7e;
              pcVar35 = (comm *)((long)&((_Elt_pointer)pcVar35)->first + 1);
              plVar7 = plVar7 + -2;
              ppVar38 = (_Elt_pointer)((long)ppVar38 + -1);
            } while (ppVar38 != (_Elt_pointer)0x0);
            ppVar38 = (_Elt_pointer)0x0;
            pcVar35 = (comm *)local_88;
          }
LAB_0013fd7e:
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (ppVar8[-1].first !=
                local_108.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)ppVar38].first) goto LAB_0013fe32;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start
              [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
                   local_150 + (long)ppVar38;
              operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start
              [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
                   local_150 + (long)ppVar38;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            goto LAB_0013fd7e;
          }
        }
      }
LAB_0013fe32:
      ppVar38 = (_Elt_pointer)((long)&((_Elt_pointer)pcVar35)->first + 1);
    } while (ppVar38 < local_188);
  }
  pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar22 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_180 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_178 = (comm *)(left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    pppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar20 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar25 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar39 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pppVar11 = pppVar10;
      ppVar21 = ppVar20;
      ppVar26 = ppVar25;
      while( true ) {
        lVar36 = (long)ppVar21 - (long)ppVar26 >> 4;
        uVar33 = lVar36 - 1;
        if (uVar33 < 0x20) {
          ppVar15 = ppVar21 + -1;
        }
        else {
          uVar12 = uVar33 >> 5 | 0xf800000000000000;
          if (1 < lVar36) {
            uVar12 = uVar33 >> 5;
          }
          ppVar15 = pppVar11[uVar12] + uVar33 + uVar12 * -0x20;
        }
        if (ppVar15 == local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar15 = ppVar20;
        if (ppVar20 == ppVar25) {
          ppVar15 = pppVar10[-1] + 0x20;
        }
        if (uVar33 < 0x20) {
          ppVar18 = ppVar21 + -1;
          ppVar17 = ppVar26;
          pppVar30 = pppVar11;
        }
        else {
          uVar12 = uVar33 >> 5 | 0xf800000000000000;
          if (1 < lVar36) {
            uVar12 = uVar33 >> 5;
          }
          pppVar30 = pppVar11 + uVar12;
          ppVar17 = *pppVar30;
          ppVar18 = ppVar17 + uVar33 + uVar12 * -0x20;
        }
        if (ppVar18 == ppVar17) {
          ppVar18 = pppVar30[-1] + 0x20;
        }
        if (ppVar15[-1].first != ppVar18[-1].first) break;
        if (ppVar21 == ppVar26) {
          ppVar26 = pppVar11[-1];
          pppVar11 = pppVar11 + -1;
          ppVar21 = ppVar26 + 0x20;
        }
        ppVar15 = ppVar20;
        if (ppVar20 == ppVar25) {
          ppVar15 = pppVar10[-1] + 0x20;
        }
        ppVar21 = ppVar21 + -1;
        ppVar18 = ppVar21;
        if (ppVar21 == ppVar26) {
          ppVar18 = pppVar11[-1] + 0x20;
        }
        puVar39[ppVar18[-1].second] = ppVar15[-1].second;
      }
      if (ppVar20 == ppVar25) {
        ppVar20 = pppVar10[-1] + 0x20;
      }
      (&((_Elt_pointer)local_178)->first)[ppVar20[-1].second] = local_118;
      if (ppVar21 == ppVar26) {
        ppVar26 = pppVar11[-1];
        pppVar11 = pppVar11 + -1;
        ppVar21 = ppVar26 + 0x20;
      }
      ppVar20 = ppVar21 + -1;
      pppVar10 = pppVar11;
      ppVar25 = ppVar26;
    } while (ppVar20 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1d8._M_impl.super__Deque_impl_data._M_start._M_node <
      local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      pppVar11 = pppVar10 + 1;
      operator_delete(pppVar10[1]);
      pppVar10 = pppVar11;
    } while (pppVar11 < local_180);
  }
  pvVar5 = local_158;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar38;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar8;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar22;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar9;
  puVar39 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar39) {
    uVar34 = 0;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        bVar40 = false;
        do {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar38[-1].first <= puVar39[uVar34]) {
            if (!bVar40) {
              ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (puVar39[uVar34] == ppVar38[-1].first) {
                ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar34;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                }
                else {
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
            }
            break;
          }
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar34;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar40 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        } while (!bVar40);
      }
      pvVar6 = local_170;
      local_128.first =
           (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar34];
      local_128.second = uVar34;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_128);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_128.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar34;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar34 = uVar34 + 1;
      puVar39 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar34 < (ulong)((long)(pvVar6->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar39 >> 3
                             ));
  }
  if (local_80 != local_188) {
    lVar31 = (long)local_80 - (long)local_188;
    lVar36 = 0;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      lVar19 = (long)&local_188->first + lVar36;
      ppVar37 = local_108.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar19;
      uVar34 = lVar19 + local_150;
      bVar40 = false;
      do {
        ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar38[-1].first <= ppVar37->first) {
          if (!bVar40) {
            ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (ppVar37->first == ppVar38[-1].first) {
              ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              (local_158->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar34;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
          }
          break;
        }
        ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (local_158->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar38[-1].second] = uVar34;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        bVar40 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar40);
      lVar36 = lVar36 + 1;
    } while (lVar36 != lVar31 + (ulong)(lVar31 == 0));
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar39 = (local_158->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar38 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar38 == ppVar8) {
        ppVar8 = pppVar9[-1];
        pppVar9 = pppVar9 + -1;
        puVar39[ppVar8[0x1f].second] = local_118;
        ppVar38 = ppVar8 + 0x20;
      }
      else {
        puVar39[ppVar38[-1].second] = local_118;
      }
      ppVar38 = ppVar38 + -1;
    } while (ppVar38 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_168,&local_108);
  if (local_108.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1d8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}